

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayingState.cpp
# Opt level: O1

void __thiscall
PlayingState::CmdSetCourse
          (PlayingState *this,string *input,shared_ptr<Connection> *connection,
          shared_ptr<GameData> *game_data)

{
  int iVar1;
  int iVar2;
  _func_int **pp_Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pcVar4;
  element_type *name;
  char *pcVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  char cVar9;
  element_type *peVar10;
  element_type *extraout_RAX;
  element_type *peVar11;
  Ship *this_01;
  ostream *poVar12;
  undefined8 uVar13;
  undefined1 InSpace;
  ulong uVar14;
  _Base_ptr __nptr;
  Ship *unaff_R13;
  double dVar15;
  shared_ptr<Planet> sVar16;
  shared_ptr<GameData> game_data_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  params;
  shared_ptr<Ship> ship;
  shared_ptr<Planet> planet;
  shared_ptr<Player> player;
  string data;
  stringstream ss;
  double local_430;
  double local_428;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_420;
  char *local_408;
  int local_3fc;
  undefined1 local_3f8 [48];
  shared_ptr<Connection> local_3c8;
  shared_ptr<Connection> local_3b8;
  element_type *local_3a8;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_3a0;
  element_type *local_398;
  _Base_ptr local_390;
  _Base_ptr local_388;
  size_t local_380;
  undefined1 local_378 [40];
  string local_350;
  string local_330;
  undefined1 local_310 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f0;
  undefined1 local_2e0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d0;
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [32];
  undefined1 local_290 [32];
  undefined1 *local_270 [2];
  undefined1 local_260 [16];
  undefined1 local_250 [32];
  string local_230;
  string local_210;
  _Base_ptr local_1f0;
  _Rb_tree<int,_std::pair<const_int,_std::shared_ptr<Connection>_>,_std::_Select1st<std::pair<const_int,_std::shared_ptr<Connection>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Connection>_>_>_>
  local_1e8;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [7];
  ios_base local_138 [264];
  
  InSpace = SUB81(game_data,0);
  local_388 = (_Base_ptr)local_378;
  pp_Var3 = (this->super_GameState)._vptr_GameState;
  local_3f8._16_8_ = connection;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_388,pp_Var3,
             &(((this->super_GameState).game_data.
                super___shared_ptr<GameData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_connections).
              _M_t._M_impl.field_0x0 + (long)pp_Var3);
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_230,local_388,(undefined1 *)((long)&local_388->_M_color + local_380));
  Tokenizer::GetAllTokens(&local_420,&local_230);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p);
  }
  Connection::GetPlayer((Connection *)(input->_M_dataplus)._M_p);
  Entity::GetShip((Entity *)local_3f8);
  local_3b8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(input->_M_dataplus)._M_p;
  local_3b8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)input->_M_string_length;
  if (local_3b8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    InSpace = 0x50;
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_3b8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_3b8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_3b8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_3b8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  this_00 = (((__shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2> *)local_3f8._16_8_)->_M_refcount
            )._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  game_data_00.super___shared_ptr<GameData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
  game_data_00.super___shared_ptr<GameData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_398;
  bVar7 = CheckCockpitCommand(&local_3b8,game_data_00,(bool)InSpace);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (local_3b8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3b8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (!bVar7) goto LAB_001499af;
  if (local_420.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_420.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    bVar7 = false;
  }
  else {
    local_250._0_8_ = local_250 + 0x10;
    pcVar4 = ((local_420.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_260 + 0x10),pcVar4,
               pcVar4 + (local_420.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
    bVar7 = Utils::IsNumber((string *)(local_260 + 0x10));
    bVar7 = !bVar7;
    if ((_Base_ptr)local_250._0_8_ != (_Base_ptr)(local_250 + 0x10)) {
      operator_delete((void *)local_250._0_8_);
    }
  }
  if (bVar7) {
    name = ((__shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2> *)local_3f8._16_8_)->_M_ptr;
    pcVar4 = ((local_420.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
    local_270[0] = local_260;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_270,pcVar4,
               pcVar4 + (local_420.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
    sVar16 = GameData::GetPlanet((GameData *)&local_3a8,(string *)name);
    peVar10 = sVar16.super___shared_ptr<Planet,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (local_270[0] != local_260) {
      operator_delete(local_270[0]);
      peVar10 = extraout_RAX;
    }
    local_3f8._28_4_ =
         (undefined4)CONCAT71((int7)((ulong)peVar10 >> 8),local_3a8 != (element_type *)0x0);
    if (local_3a8 == (element_type *)0x0) {
      local_290._0_8_ = (_Base_ptr)(local_290 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_290,"That planet does not exist in this system\n","");
      local_3c8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)(input->_M_dataplus)._M_p;
      local_3c8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)input->_M_string_length;
      if (local_3c8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_3c8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_3c8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_3c8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_3c8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      Sender::Send((string *)local_290,&local_3c8);
      if (local_3c8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_3c8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      local_408 = (char *)0x0;
      if ((_Base_ptr)local_290._0_8_ != (_Base_ptr)(local_290 + 0x10)) {
        operator_delete((void *)local_290._0_8_);
      }
      local_428 = 0.0;
      local_430 = 0.0;
    }
    else {
      Planet::GetCoordinates((Planet *)local_3a8);
      local_408 = (char *)local_1b8._0_8_;
      local_428 = (double)local_1b8._8_8_;
      local_430 = (double)local_1a8[0]._0_8_;
      if ((ulong)((long)local_420.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_420.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
        bVar7 = false;
      }
      else {
        local_2b0._0_8_ = local_2b0 + 0x10;
        pcVar4 = local_420.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_2b0,pcVar4,
                   pcVar4 + local_420.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length);
        bVar7 = Utils::IsNumber((string *)local_2b0);
        if ((_Base_ptr)local_2b0._0_8_ != (_Base_ptr)(local_2b0 + 0x10)) {
          operator_delete((void *)local_2b0._0_8_);
        }
      }
      unaff_R13 = (Ship *)local_3f8._0_8_;
      if (bVar7 != false) {
        __nptr = (_Base_ptr)
                 local_420.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
        this_01 = (Ship *)__errno_location();
        local_3fc = *(int *)&(this_01->super_Area).m_area_name._M_dataplus._M_p;
        *(int *)&(this_01->super_Area).m_area_name._M_dataplus._M_p = 0;
        dVar15 = strtod((char *)__nptr,(char **)&local_1f0);
        peVar11 = local_3a8;
        if (local_1f0 == __nptr) goto LAB_00149a2a;
        iVar1 = *(int *)&(this_01->super_Area).m_area_name._M_dataplus._M_p;
        if (iVar1 == 0) {
          *(int *)&(this_01->super_Area).m_area_name._M_dataplus._M_p = local_3fc;
LAB_001496d1:
          Ship::SetSpeed(unaff_R13,dVar15);
          goto LAB_00149741;
        }
        if (iVar1 != 0x22) goto LAB_001496d1;
        std::__throw_out_of_range("stod");
LAB_00149564:
        *(int *)&(((Area *)&peVar11->m_id)->m_area_name)._M_dataplus._M_p = (int)__nptr;
LAB_00149567:
        pcVar5 = local_420.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
        iVar1 = *(int *)&(((Area *)&peVar11->m_id)->m_area_name)._M_dataplus._M_p;
        *(int *)&(((Area *)&peVar11->m_id)->m_area_name)._M_dataplus._M_p = 0;
        local_428 = strtod(pcVar5,(char **)local_1b8);
        if ((char *)local_1b8._0_8_ == pcVar5) goto LAB_00149a12;
        iVar2 = *(int *)&(((Area *)&peVar11->m_id)->m_area_name)._M_dataplus._M_p;
        if (iVar2 == 0) {
LAB_001495b5:
          *(int *)&(((Area *)&peVar11->m_id)->m_area_name)._M_dataplus._M_p = iVar1;
        }
        else if (iVar2 == 0x22) {
          std::__throw_out_of_range("stod");
          goto LAB_001495b5;
        }
        pcVar5 = local_420.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p;
        iVar1 = *(int *)&(((Area *)&peVar11->m_id)->m_area_name)._M_dataplus._M_p;
        *(int *)&(((Area *)&peVar11->m_id)->m_area_name)._M_dataplus._M_p = 0;
        local_430 = strtod(pcVar5,(char **)local_1b8);
        if ((char *)local_1b8._0_8_ == pcVar5) goto LAB_00149a1e;
        iVar2 = *(int *)&(((Area *)&peVar11->m_id)->m_area_name)._M_dataplus._M_p;
        if (iVar2 == 0) {
LAB_00149606:
          *(int *)&(((Area *)&peVar11->m_id)->m_area_name)._M_dataplus._M_p = iVar1;
        }
        else if (iVar2 == 0x22) {
          std::__throw_out_of_range("stod");
          goto LAB_00149606;
        }
        if ((ulong)((long)local_420.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_420.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) < 0x61) {
          bVar7 = false;
        }
        else {
          local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
          pcVar4 = local_420.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[3]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_330,pcVar4,
                     pcVar4 + local_420.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[3]._M_string_length);
          bVar7 = Utils::IsNumber(&local_330);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_330._M_dataplus._M_p != &local_330.field_2) {
            operator_delete(local_330._M_dataplus._M_p);
          }
        }
        this_01 = (Ship *)local_3f8._0_8_;
        if (bVar7 == false) {
LAB_001496c2:
          cVar9 = '\x01';
        }
        else {
          pcVar5 = local_420.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[3]._M_dataplus._M_p;
          iVar1 = *(int *)&(((Area *)&peVar11->m_id)->m_area_name)._M_dataplus._M_p;
          *(int *)&(((Area *)&peVar11->m_id)->m_area_name)._M_dataplus._M_p = 0;
          unaff_R13 = (Ship *)local_1b8;
          dVar15 = strtod(pcVar5,(char **)unaff_R13);
          if ((char *)local_1b8._0_8_ == pcVar5) {
LAB_00149a36:
            uVar13 = std::__throw_invalid_argument("stod");
            if ((Ship *)local_310._0_8_ != unaff_R13) {
              operator_delete((void *)local_310._0_8_);
            }
            if ((Ship *)local_2f0._M_allocated_capacity != this_01) {
              operator_delete((void *)local_2f0._M_allocated_capacity);
            }
            if ((element_type *)local_2d0._M_allocated_capacity != peVar11) {
              operator_delete((void *)local_2d0._M_allocated_capacity);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3f8._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3f8._8_8_);
            }
            if (local_390 != (_Base_ptr)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_390);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_420);
            if (local_388 != (_Base_ptr)local_378) {
              operator_delete(local_388);
            }
            _Unwind_Resume(uVar13);
          }
          iVar2 = *(int *)&(((Area *)&peVar11->m_id)->m_area_name)._M_dataplus._M_p;
          if (iVar2 == 0) {
            *(int *)&(((Area *)&peVar11->m_id)->m_area_name)._M_dataplus._M_p = iVar1;
          }
          else if (iVar2 == 0x22) {
            std::__throw_out_of_range("stod");
            goto LAB_001496c2;
          }
          Ship::SetSpeed(this_01,dVar15);
          cVar9 = '\x01';
        }
        goto LAB_00149760;
      }
    }
LAB_00149741:
    if (local_3a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3a0._M_pi);
    }
    cVar9 = (char)local_3f8._28_4_;
    if (local_3a8 == (element_type *)0x0) goto LAB_001499af;
  }
  else {
    uVar14 = (long)local_420.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_420.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    if (uVar14 < 0x41) {
LAB_001493ae:
      bVar7 = false;
LAB_001493b1:
      bVar6 = false;
      bVar8 = false;
    }
    else {
      local_2d0._M_allocated_capacity = (size_type)(local_2e0 + 0x20);
      pcVar4 = ((local_420.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_2e0 + 0x10),pcVar4,
                 pcVar4 + (local_420.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
      bVar7 = Utils::IsNumber((string *)(local_2e0 + 0x10));
      if (!bVar7) goto LAB_001493ae;
      local_2f0._M_allocated_capacity = (size_type)local_2e0;
      pcVar4 = local_420.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2f0,pcVar4,
                 pcVar4 + local_420.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length);
      bVar7 = Utils::IsNumber((string *)&local_2f0);
      if (!bVar7) {
        bVar7 = true;
        goto LAB_001493b1;
      }
      unaff_R13 = (Ship *)(local_310 + 0x10);
      pcVar4 = local_420.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p;
      local_310._0_8_ = unaff_R13;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_310,pcVar4,
                 pcVar4 + local_420.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[2]._M_string_length);
      bVar8 = Utils::IsNumber((string *)local_310);
      bVar7 = true;
      bVar6 = true;
    }
    if ((bVar6) && ((Ship *)local_310._0_8_ != (Ship *)(local_310 + 0x10))) {
      operator_delete((void *)local_310._0_8_);
    }
    if ((bVar7) && ((Ship *)local_2f0._M_allocated_capacity != (Ship *)local_2e0)) {
      operator_delete((void *)local_2f0._M_allocated_capacity);
    }
    if ((0x40 < uVar14) &&
       ((element_type *)local_2d0._M_allocated_capacity != (element_type *)(local_2e0 + 0x20))) {
      operator_delete((void *)local_2d0._M_allocated_capacity);
    }
    if (bVar8 != false) {
      pcVar5 = ((local_420.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
      peVar11 = (element_type *)__errno_location();
      __nptr = (_Base_ptr)(ulong)*(uint *)&(((Area *)&peVar11->m_id)->m_area_name)._M_dataplus._M_p;
      *(int *)&(((Area *)&peVar11->m_id)->m_area_name)._M_dataplus._M_p = 0;
      local_408 = (char *)strtod(pcVar5,(char **)local_1b8);
      if ((char *)local_1b8._0_8_ == pcVar5) {
        std::__throw_invalid_argument("stod");
LAB_00149a12:
        std::__throw_invalid_argument("stod");
LAB_00149a1e:
        this_01 = (Ship *)local_1b8;
        std::__throw_invalid_argument("stod");
LAB_00149a2a:
        std::__throw_invalid_argument("stod");
        goto LAB_00149a36;
      }
      iVar1 = *(int *)&(((Area *)&peVar11->m_id)->m_area_name)._M_dataplus._M_p;
      if (iVar1 == 0) goto LAB_00149564;
      if (iVar1 != 0x22) goto LAB_00149567;
      std::__throw_out_of_range("stod");
    }
    local_408 = (char *)0x0;
    cVar9 = '\0';
    local_428 = 0.0;
    local_430 = 0.0;
  }
LAB_00149760:
  if (cVar9 == '\0') {
    local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_350,"Course not set, bad parameters\n","");
    local_3f8._32_8_ = (input->_M_dataplus)._M_p;
    local_3f8._40_8_ = input->_M_string_length;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3f8._40_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3f8._40_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3f8._40_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3f8._40_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3f8._40_8_)->_M_use_count + 1;
      }
    }
    Sender::Send(&local_350,(shared_ptr<Connection> *)(local_3f8 + 0x20));
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3f8._40_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3f8._40_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350._M_dataplus._M_p != &local_350.field_2) {
      operator_delete(local_350._M_dataplus._M_p);
    }
  }
  else {
    Ship::SetDestination((Ship *)local_3f8._0_8_,(double)local_408,local_428,local_430);
    Ship::SetInOrbit((Ship *)local_3f8._0_8_,false);
    dVar15 = Ship::GetSpeed((Ship *)local_3f8._0_8_);
    ChangeSpeed(dVar15,(shared_ptr<Ship> *)local_3f8);
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b8 + 0x10),"Course set for ",0xf);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1b8 + 0x10),"X: ",3);
    poVar12 = std::ostream::_M_insert<double>((double)local_408);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," Y: ",4);
    poVar12 = std::ostream::_M_insert<double>(local_428);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," Z: ",4);
    poVar12 = std::ostream::_M_insert<double>(local_430);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," at speed ",10);
    dVar15 = Ship::GetSpeed((Ship *)local_3f8._0_8_);
    poVar12 = std::ostream::_M_insert<double>(dVar15);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
    std::__cxx11::stringbuf::str();
    GameData::GetLoggedInConnections
              ((map<int,_std::shared_ptr<Connection>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Connection>_>_>_>
                *)&local_1e8,
               (GameData *)
               ((__shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2> *)local_3f8._16_8_)->_M_ptr);
    Ship::GetPlayerIDs((vector<int,_std::allocator<int>_> *)(local_378 + 0x10),
                       (Ship *)local_3f8._0_8_);
    Sender::SendToMultiple
              (&local_210,
               (map<int,_std::shared_ptr<Connection>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Connection>_>_>_>
                *)&local_1e8,(vector<int,_std::allocator<int>_> *)(local_378 + 0x10));
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_378._16_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      operator_delete((void *)local_378._16_8_);
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_std::shared_ptr<Connection>_>,_std::_Select1st<std::pair<const_int,_std::shared_ptr<Connection>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Connection>_>_>_>
    ::~_Rb_tree(&local_1e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
  }
LAB_001499af:
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3f8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3f8._8_8_);
  }
  if (local_390 != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_390);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_420);
  if (local_388 != (_Base_ptr)local_378) {
    operator_delete(local_388);
  }
  return;
}

Assistant:

void PlayingState::CmdSetCourse(const std::string &input, std::shared_ptr<Connection> connection,
                                std::shared_ptr<GameData> game_data) {
    std::string data = input;
    auto params = Tokenizer::GetAllTokens(data);
    double x = 0;
    double y = 0;
    double z = 0;
    auto player = connection->GetPlayer();
    bool course_set = false;
    auto ship = player->GetShip();
    if (CheckCockpitCommand(connection, game_data, true)) {
        // TODO: Skill check

        if (params.size() > 0 and !Utils::IsNumber(params[0])) {
            auto planet = game_data->GetPlanet(params[0]);
            if (planet == nullptr) {
                Sender::Send("That planet does not exist in this system\n", connection);
                return;
            }
            else {
                Utils::Vector3 coords = planet->GetCoordinates();
                x = coords.x;
                y = coords.y;
                z = coords.z;
                if (params.size() > 1 and Utils::IsNumber(params[1])) {
                    ship->SetSpeed(std::stod(params[1]));
                }
                course_set = true;
            }
        }
        else if (params.size() >= 3 and Utils::IsNumber(params[0])
                 and Utils::IsNumber(params[1]) and Utils::IsNumber(params[2])) {
            x = std::stod(params[0]);
            y = std::stod(params[1]);
            z = std::stod(params[2]);
            if (params.size() >= 4 and Utils::IsNumber(params[3])) {
                ship->SetSpeed(std::stod(params[3]));
            }
            course_set = true;
        }
        if (!course_set) {
            Sender::Send("Course not set, bad parameters\n", connection);
            return;
        }
        ship->SetDestination(x, y, z);
        ship->SetInOrbit(false);
        ChangeSpeed(ship->GetSpeed(), ship);
        std::stringstream ss;
        ss << "Course set for " << "X: " << x << " Y: " << y
        << " Z: " << z << " at speed " << ship->GetSpeed() << "\n";
        Sender::SendToMultiple(ss.str(), game_data->GetLoggedInConnections(),
                               ship->GetPlayerIDs());
    }
}